

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O3

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int iVar5;
  Mat *pMVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_38;
  
  pMVar6 = (Mat *)operator_new(0x80);
  local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_finish = pMVar6 + 2;
  pMVar6->data = (void *)0x0;
  pMVar6->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar6->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar6->elemsize + 4) = 0;
  pMVar6[1].h = 0;
  pMVar6[1].c = 0;
  pMVar6[1].cstep = 0;
  pMVar6[1].allocator = (Allocator *)0x0;
  pMVar6[1].dims = 0;
  pMVar6[1].w = 0;
  *(undefined8 *)((long)&pMVar6[1].refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar6[1].elemsize + 4) = 0;
  pMVar6[1].data = (void *)0x0;
  pMVar6[1].refcount = (int *)0x0;
  pMVar6->h = 0;
  pMVar6->c = 0;
  pMVar6->cstep = 0;
  pMVar6->allocator = (Allocator *)0x0;
  pMVar6->dims = 0;
  pMVar6->w = 0;
  local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start = pMVar6;
  local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pMVar6 != bottom_top_blob) {
    piVar1 = bottom_top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      piVar1 = pMVar6->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (pMVar6->allocator == (Allocator *)0x0) {
            if (pMVar6->data != (void *)0x0) {
              free(pMVar6->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar6->allocator + 0x18))();
          }
        }
      }
    }
    pMVar6->refcount = (int *)0x0;
    piVar1 = bottom_top_blob->refcount;
    pMVar6->data = bottom_top_blob->data;
    pMVar6->refcount = piVar1;
    pMVar6->elemsize = bottom_top_blob->elemsize;
    pMVar6->packing = bottom_top_blob->packing;
    pMVar6->allocator = bottom_top_blob->allocator;
    iVar5 = bottom_top_blob->w;
    iVar2 = bottom_top_blob->h;
    iVar3 = bottom_top_blob->c;
    pMVar6->dims = bottom_top_blob->dims;
    pMVar6->w = iVar5;
    pMVar6->h = iVar2;
    pMVar6->c = iVar3;
    pMVar6->cstep = bottom_top_blob->cstep;
  }
  pMVar4 = local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar6 = local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  if (pMVar6 != &this->scale_data) {
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (**(code **)(*(long *)local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start[1].allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pMVar4[1].refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar4[1].elemsize + 4) = 0;
    pMVar6->data = (void *)0x0;
    pMVar4[1].refcount = (int *)0x0;
    pMVar4[1].dims = 0;
    pMVar4[1].w = 0;
    pMVar4[1].h = 0;
    pMVar4[1].c = 0;
    pMVar4[1].cstep = 0;
    piVar1 = (this->scale_data).refcount;
    pMVar4[1].data = (this->scale_data).data;
    pMVar4[1].refcount = piVar1;
    pMVar4[1].elemsize = (this->scale_data).elemsize;
    pMVar4[1].packing = (this->scale_data).packing;
    pMVar4[1].allocator = (this->scale_data).allocator;
    iVar5 = (this->scale_data).w;
    iVar2 = (this->scale_data).h;
    iVar3 = (this->scale_data).c;
    pMVar4[1].dims = (this->scale_data).dims;
    pMVar4[1].w = iVar5;
    pMVar4[1].h = iVar2;
    pMVar4[1].c = iVar3;
    pMVar4[1].cstep = (this->scale_data).cstep;
  }
  iVar5 = (*(this->super_Layer)._vptr_Layer[8])(this,&local_38,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_38);
  return iVar5;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}